

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,false,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  sel_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  
  if (count + 0x3f < 0x40) {
    lVar11 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar11 = 0;
    uVar12 = 0;
    uVar9 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar1[uVar12];
      }
      uVar14 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar14 = count;
      }
      uVar7 = uVar9;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar9 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar10 = uVar9 << 4 | 8;
          do {
            uVar7 = uVar9;
            if (psVar2 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar2[uVar9];
            }
            uVar13 = *(ulong *)((long)rdata + (uVar10 - 8));
            lVar5 = *(long *)((long)&rdata->lower + uVar10);
            lVar6 = *(long *)((long)&ldata->lower + uVar10);
            uVar4 = *(ulong *)((long)ldata + (uVar10 - 8));
            psVar3[lVar11] = (sel_t)uVar7;
            lVar11 = lVar11 + (ulong)(uVar4 < uVar13 && lVar5 == lVar6 ||
                                     lVar5 != lVar6 && lVar6 <= lVar5);
            uVar9 = uVar9 + 1;
            uVar10 = uVar10 + 0x10;
            uVar7 = uVar9;
          } while (uVar14 != uVar9);
        }
      }
      else if (uVar15 == 0) {
        uVar7 = uVar14;
        if (uVar9 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar8 = (sel_t)uVar9;
            if (psVar2 != (sel_t *)0x0) {
              sVar8 = psVar2[uVar9];
            }
            psVar3[lVar11] = sVar8;
            lVar11 = lVar11 + 1;
            uVar9 = uVar9 + 1;
          } while (uVar14 != uVar9);
        }
      }
      else if (uVar9 < uVar14) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        uVar10 = uVar9 << 4 | 8;
        uVar7 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar8 = (int)uVar9 + (int)uVar7;
          }
          else {
            sVar8 = psVar2[uVar9 + uVar7];
          }
          if ((uVar15 >> (uVar7 & 0x3f) & 1) == 0) {
            uVar13 = 1;
          }
          else {
            lVar5 = *(long *)((long)&rdata->lower + uVar10);
            lVar6 = *(long *)((long)&ldata->lower + uVar10);
            uVar13 = (ulong)(*(ulong *)((long)ldata + (uVar10 - 8)) <
                             *(ulong *)((long)rdata + (uVar10 - 8)) && lVar5 == lVar6 ||
                            lVar5 != lVar6 && lVar6 <= lVar5);
          }
          psVar3[lVar11] = sVar8;
          lVar11 = lVar11 + uVar13;
          uVar7 = uVar7 + 1;
          uVar10 = uVar10 + 0x10;
        } while ((uVar9 - uVar14) + uVar7 != 0);
        uVar7 = uVar9 + uVar7;
      }
      uVar12 = uVar12 + 1;
      uVar9 = uVar7;
    } while (uVar12 != count + 0x3f >> 6);
  }
  return count - lVar11;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}